

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

void ma_dr_mp3_uninit(ma_dr_mp3 *pMP3)

{
  if (pMP3 != (ma_dr_mp3 *)0x0) {
    if ((pMP3->onRead == ma_dr_mp3__on_read_stdio) && ((FILE *)pMP3->pUserData != (FILE *)0x0)) {
      fclose((FILE *)pMP3->pUserData);
      pMP3->pUserData = (void *)0x0;
    }
    ma_dr_mp3__free_from_callbacks(pMP3->pData,&pMP3->allocationCallbacks);
    return;
  }
  return;
}

Assistant:

MA_API void ma_dr_mp3_uninit(ma_dr_mp3* pMP3)
{
    if (pMP3 == NULL) {
        return;
    }
#ifndef MA_DR_MP3_NO_STDIO
    if (pMP3->onRead == ma_dr_mp3__on_read_stdio) {
        FILE* pFile = (FILE*)pMP3->pUserData;
        if (pFile != NULL) {
            fclose(pFile);
            pMP3->pUserData = NULL;
        }
    }
#endif
    ma_dr_mp3__free_from_callbacks(pMP3->pData, &pMP3->allocationCallbacks);
}